

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall
CaPS_SA::Suffix_Array<unsigned_long>::compute_partition_boundary_lcp
          (Suffix_Array<unsigned_long> *this)

{
  size_t start;
  ostream *poVar1;
  nanoseconds *in_RDI;
  rep_conflict rVar2;
  time_point t_e;
  anon_class_8_1_8991fb9c compute_boundary_lcp;
  time_point t_s;
  undefined8 in_stack_ffffffffffffffd0;
  undefined1 conservative;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffd8;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffe0;
  
  conservative = (undefined1)((ulong)in_stack_ffffffffffffffd0 >> 0x38);
  start = std::chrono::_V2::system_clock::now();
  parlay::
  parallel_for<CaPS_SA::Suffix_Array<unsigned_long>::compute_partition_boundary_lcp()::_lambda(unsigned_long)_1_const&>
            (start,(size_t)in_RDI,in_stack_ffffffffffffffe0,(long)in_stack_ffffffffffffffd8,
             (bool)conservative);
  std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "Computed the LCPs at the partition boundaries. Time taken: ");
  std::chrono::operator-
            (in_stack_ffffffffffffffd8,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)poVar1);
  rVar2 = anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)poVar1,in_RDI);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," seconds.\n");
  return;
}

Assistant:

void Suffix_Array<T_idx_>::compute_partition_boundary_lcp()
{
    const auto t_s = now();

    const auto compute_boundary_lcp =
        [&](const idx_t j)
        {
            const auto part_idx = part_size_scan_[j];
            LCP_[part_idx] = LCP(T_ + SA_[part_idx - 1], T_ + SA_[part_idx], n_ - std::max(SA_[part_idx - 1], SA_[part_idx]));
        };

    parlay::parallel_for(1, p_, compute_boundary_lcp, 1);

    const auto t_e = now();
    std::cerr << "Computed the LCPs at the partition boundaries. Time taken: " << duration(t_e - t_s) << " seconds.\n";
}